

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O0

void __thiscall QObjectPrivate::reinitBindingStorageAfterThreadMove(QObjectPrivate *this)

{
  QList<QObject_*> *this_00;
  qsizetype qVar1;
  long in_RDI;
  int i;
  qsizetype in_stack_ffffffffffffffd8;
  QBindingStorage *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  QBindingStorage::reinitAfterThreadMove(in_stack_ffffffffffffffe0);
  iVar2 = 0;
  while( true ) {
    this_00 = (QList<QObject_*> *)(long)iVar2;
    qVar1 = QList<QObject_*>::size((QList<QObject_*> *)(in_RDI + 0x18));
    if (qVar1 <= (long)this_00) break;
    QList<QObject_*>::operator[](this_00,in_stack_ffffffffffffffd8);
    QObject::d_func((QObject *)0x3eb5b8);
    reinitBindingStorageAfterThreadMove((QObjectPrivate *)CONCAT44(iVar2,in_stack_fffffffffffffff0))
    ;
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void QObjectPrivate::reinitBindingStorageAfterThreadMove()
{
    bindingStorage.reinitAfterThreadMove();
    for (int i = 0; i < children.size(); ++i)
        children[i]->d_func()->reinitBindingStorageAfterThreadMove();
}